

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  TestResult *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  TestPartResult *pTVar1;
  ostream *poVar2;
  int line;
  TimeInMillis ms;
  TestResult *result;
  char *pcVar3;
  internal *this_00;
  int i;
  undefined1 local_e8 [8];
  string kTestcase;
  string detail;
  undefined1 local_88 [8];
  string summary;
  undefined1 local_60 [8];
  string location;
  
  location.field_2._8_8_ = test_info;
  std::__cxx11::string::string((string *)local_e8,"testcase",(allocator *)local_60);
  std::operator<<(stream,"    <testcase");
  std::__cxx11::string::string
            ((string *)local_60,"name",(allocator *)(kTestcase.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)local_88,*(char **)(location.field_2._8_8_ + 0x20),
             (allocator *)(detail.field_2._M_local_buf + 8));
  OutputXmlAttribute(stream,(string *)local_e8,(string *)local_60,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_60);
  if ((*(long **)(location.field_2._8_8_ + 0x48) != (long *)0x0) &&
     (**(long **)(location.field_2._8_8_ + 0x48) != 0)) {
    std::__cxx11::string::string
              ((string *)local_60,"value_param",(allocator *)(kTestcase.field_2._M_local_buf + 8));
    if (*(undefined8 **)(location.field_2._8_8_ + 0x48) == (undefined8 *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = (char *)**(undefined8 **)(location.field_2._8_8_ + 0x48);
    }
    std::__cxx11::string::string
              ((string *)local_88,pcVar3,(allocator *)(detail.field_2._M_local_buf + 8));
    OutputXmlAttribute(stream,(string *)local_e8,(string *)local_60,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_60);
  }
  if ((*(long **)(location.field_2._8_8_ + 0x40) != (long *)0x0) &&
     (**(long **)(location.field_2._8_8_ + 0x40) != 0)) {
    std::__cxx11::string::string
              ((string *)local_60,"type_param",(allocator *)(kTestcase.field_2._M_local_buf + 8));
    if (*(undefined8 **)(location.field_2._8_8_ + 0x40) == (undefined8 *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = (char *)**(undefined8 **)(location.field_2._8_8_ + 0x40);
    }
    std::__cxx11::string::string
              ((string *)local_88,pcVar3,(allocator *)(detail.field_2._M_local_buf + 8));
    OutputXmlAttribute(stream,(string *)local_e8,(string *)local_60,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_60);
  }
  std::__cxx11::string::string
            ((string *)local_60,"status",(allocator *)(kTestcase.field_2._M_local_buf + 8));
  pcVar3 = "notrun";
  if (*(char *)(location.field_2._8_8_ + 0x80) != '\0') {
    pcVar3 = "run";
  }
  std::__cxx11::string::string
            ((string *)local_88,pcVar3,(allocator *)(detail.field_2._M_local_buf + 8));
  OutputXmlAttribute(stream,(string *)local_e8,(string *)local_60,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string
            ((string *)local_60,"time",(allocator *)(kTestcase.field_2._M_local_buf + 8));
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)local_88,*(internal **)(location.field_2._8_8_ + 0x100),ms);
  OutputXmlAttribute(stream,(string *)local_e8,(string *)local_60,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string
            ((string *)local_60,"classname",(allocator *)(kTestcase.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)local_88,test_case_name,(allocator *)(detail.field_2._M_local_buf + 8));
  OutputXmlAttribute(stream,(string *)local_e8,(string *)local_60,(string *)local_88);
  this = (TestResult *)(location.field_2._8_8_ + 0x90);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_60);
  TestPropertiesAsXmlAttributes_abi_cxx11_
            ((string *)local_60,(XmlUnitTestResultPrinter *)this,result);
  std::operator<<(stream,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  summary.field_2._12_4_ = 0;
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (&kTestcase.field_2._M_allocated_capacity + 1);
  str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (&detail.field_2._M_allocated_capacity + 1);
  i = 0;
  while( true ) {
    line = 0x70;
    if ((int)((*(long *)(location.field_2._8_8_ + 0xd0) - *(long *)(location.field_2._8_8_ + 200)) /
             0x70) <= i) break;
    pTVar1 = TestResult::GetTestPartResult(this,i);
    if (pTVar1->type_ != kSuccess) {
      if (summary.field_2._12_4_ == 0) {
        std::operator<<(stream,">\n");
      }
      this_00 = (internal *)(pTVar1->file_name_)._M_string_length;
      if (this_00 != (internal *)0x0) {
        this_00 = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((string *)local_60,this_00,(char *)(ulong)(uint)pTVar1->line_number_,line);
      std::operator+(__return_storage_ptr__,(string *)local_60,"\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     __return_storage_ptr__,(pTVar1->summary_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      poVar2 = std::operator<<(stream,"      <failure message=\"");
      std::__cxx11::string::string
                ((string *)str,(char *)local_88,(allocator *)(summary.field_2._M_local_buf + 0xb));
      EscapeXmlAttribute(__return_storage_ptr__,str);
      poVar2 = std::operator<<(poVar2,(string *)__return_storage_ptr__);
      std::operator<<(poVar2,"\" type=\"\">");
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)str);
      std::operator+(str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60,"\n");
      std::operator+(__return_storage_ptr__,str,(pTVar1->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)str);
      RemoveInvalidXmlCharacters(str,__return_storage_ptr__);
      OutputXmlCDataSection(stream,(char *)detail.field_2._8_8_);
      std::__cxx11::string::~string((string *)str);
      std::operator<<(stream,"</failure>\n");
      summary.field_2._12_4_ = summary.field_2._12_4_ + 1;
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)local_60);
    }
    i = i + 1;
  }
  pcVar3 = "    </testcase>\n";
  if (summary.field_2._12_4_ == 0) {
    pcVar3 = " />\n";
  }
  std::operator<<(stream,pcVar3);
  std::__cxx11::string::~string((string *)local_e8);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);
  *stream << TestPropertiesAsXmlAttributes(result);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}